

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitUtils.hpp
# Opt level: O2

Comparison
Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Lhs>::compare
          (UnresolvedSplitRecord *r1,UnresolvedSplitRecord *r2)

{
  ulong uVar1;
  Comparison CVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = (r1->original)._content;
  if ((uVar1 & 3) == 0) {
    bVar3 = (*(byte *)(uVar1 + 0x28) & 8) == 0;
  }
  else {
    bVar3 = false;
  }
  uVar1 = (r2->original)._content;
  if ((uVar1 & 3) == 0) {
    bVar4 = (*(byte *)(uVar1 + 0x28) & 8) == 0;
  }
  else {
    bVar4 = false;
  }
  if ((bVar4) || (!bVar3)) {
    if ((bool)(bVar3 | bVar4 ^ 1U)) {
      CVar2 = LESS;
      if (r1->var <= r2->var) {
        CVar2 = (Comparison)(r2->var != r1->var);
      }
      return CVar2;
    }
    CVar2 = LESS;
  }
  else {
    CVar2 = GREATER;
  }
  return CVar2;
}

Assistant:

static uint64_t getBits(const uint64_t& bits) {
    auto mask = bitmask64<lower, upper>();
    return (bits & mask) >> lower;
  }